

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::clearTimeBarrier(CoreBroker *this)

{
  GlobalBrokerId id;
  BrokerBase *in_RDI;
  ActionMessage tbarrier;
  ActionMessage *in_stack_ffffffffffffff08;
  action_t in_stack_ffffffffffffff2c;
  ActionMessage *in_stack_ffffffffffffff30;
  GlobalFederateId local_c4;
  ActionMessage local_c0;
  
  ActionMessage::ActionMessage(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  id = CLI::std::atomic<helics::GlobalBrokerId>::load
                 ((atomic<helics::GlobalBrokerId> *)&in_RDI->higher_broker_id,seq_cst);
  GlobalFederateId::GlobalFederateId(&local_c4,id);
  local_c0.source_id.gid = local_c4.gid;
  local_c0.actionTime.internalTimeCode =
       (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  setActionFlag<helics::ActionMessage,helics::OperationFlags>(&local_c0,cancel_flag);
  BrokerBase::addActionMessage(in_RDI,in_stack_ffffffffffffff08);
  ActionMessage::~ActionMessage((ActionMessage *)in_RDI);
  return;
}

Assistant:

void CoreBroker::clearTimeBarrier()
{
    ActionMessage tbarrier(CMD_TIME_BARRIER_REQUEST);
    tbarrier.source_id = global_id.load();
    tbarrier.actionTime = Time::maxVal();
    setActionFlag(tbarrier, cancel_flag);
    addActionMessage(tbarrier);
}